

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::operator!=(ON_Xform *this,ON_Xform *rhs)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  double b;
  double a;
  double *y;
  double *x16;
  double *x;
  ON_Xform *rhs_local;
  ON_Xform *this_local;
  
  a = (double)rhs;
  x16 = (double *)this;
  do {
    do {
      if (this + 1 <= x16) {
        return false;
      }
      pdVar3 = x16 + 1;
      dVar1 = *x16;
      dVar4 = (double)((long)a + 8);
      dVar2 = *(double *)a;
      a = dVar4;
      x16 = pdVar3;
    } while ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2)));
  } while ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2)));
  do {
    if (this + 1 <= x16) {
      return true;
    }
    dVar1 = *(double *)a;
  } while ((!NAN(*x16)) && (a = (double)((long)a + 8), x16 = x16 + 1, !NAN(dVar1)));
  return false;
}

Assistant:

bool ON_Xform::operator!=(const ON_Xform& rhs) const
{
  // Intentionally returns false if any coefficient is a nan.
  const double* x = &m_xform[0][0];
  const double* x16 = x + 16;
  const double* y = &rhs.m_xform[0][0];
  while (x < x16)
  {
    double a = *x++;
    double b = *y++;
    if (a == b)
      continue;
    if (a != b)
    {
      while (x < x16)
      {
        a = *x++;
        b = *y++;
        if (a == a && b == b)
          continue;
        return false; // a or b is a nan.
      }
      return true;  // no nans and at least one not equal equalcoefficient.
    }
  }
  return false; // nans or equal
}